

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O1

string * __thiscall
wasm::Pass::getArgument
          (string *__return_storage_ptr__,Pass *this,string *key,string *errorTextIfMissing)

{
  size_t __n;
  _Alloc_hider _Var1;
  PassRunner *pPVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  Fatal local_200;
  string local_78;
  string local_58;
  string *local_38;
  
  bVar4 = hasArgument(this,key);
  if (!bVar4) {
    Fatal::Fatal(&local_200);
    Fatal::operator<<(&local_200,errorTextIfMissing);
    Fatal::~Fatal(&local_200);
  }
  __n = key->_M_string_length;
  local_38 = errorTextIfMissing;
  if (__n == (this->name)._M_string_length) {
    if (__n == 0) {
      bVar4 = true;
    }
    else {
      iVar5 = bcmp((key->_M_dataplus)._M_p,(this->name)._M_dataplus._M_p,__n);
      bVar4 = iVar5 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  if (bVar4) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    _Var1._M_p = (this->passArg).
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,_Var1._M_p,
               _Var1._M_p +
               (this->passArg).
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload._M_value._M_string_length);
  }
  else {
    pPVar2 = this->runner;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    pcVar3 = (key->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&local_58,pcVar3,pcVar3 + __n);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    pcVar3 = (local_38->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar3,pcVar3 + local_38->_M_string_length);
    PassOptions::getArgument(__return_storage_ptr__,&pPVar2->options,&local_58,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Pass::getArgument(const std::string& key,
                              const std::string& errorTextIfMissing) {
  if (!hasArgument(key)) {
    Fatal() << errorTextIfMissing;
  }

  return (key == name) ? *passArg
                       : getPassOptions().getArgument(key, errorTextIfMissing);
}